

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O3

void __thiscall
chrono::ChGlyphs::SetGlyphVector
          (ChGlyphs *this,uint id,ChVector<double> *mpoint,ChVector<double> *mvector,ChColor *mcolor
          )

{
  ChVector<double> *pCVar1;
  float fVar2;
  pointer pCVar3;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  
  pCVar3 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)id;
  uVar6 = ((long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) *
          -0x5555555555555555;
  if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar3 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar1 = pCVar3 + uVar5;
  if (pCVar1 != mpoint) {
    pCVar1->m_data[0] = mpoint->m_data[0];
    pCVar1->m_data[1] = mpoint->m_data[1];
    pCVar1->m_data[2] = mpoint->m_data[2];
  }
  pCVar3 = (this->vectors).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->vectors).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) *
          -0x5555555555555555;
  if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->vectors,(ulong)(id + 1));
    pCVar3 = (this->vectors).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar1 = pCVar3 + uVar5;
  if (pCVar1 != mvector) {
    pCVar1->m_data[0] = mvector->m_data[0];
    pCVar1->m_data[1] = mvector->m_data[1];
    pCVar1->m_data[2] = mvector->m_data[2];
  }
  pCVar4 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->colors).
                 super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar4 >> 2) * -0x5555555555555555;
  if (uVar6 < uVar5 || uVar6 - uVar5 == 0) {
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
              (&this->colors,(ulong)(id + 1));
    pCVar4 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  pCVar4 = pCVar4 + uVar5;
  if (pCVar4 != mcolor) {
    fVar2 = mcolor->G;
    pCVar4->R = mcolor->R;
    pCVar4->G = fVar2;
    pCVar4->B = mcolor->B;
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphVector(unsigned int id, ChVector<> mpoint, ChVector<> mvector, ChColor mcolor) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mpoint;

    if (vectors.size() <= id)
        vectors.resize(id + 1);
    vectors[id] = mvector;

    if (colors.size() <= id)
        colors.resize(id + 1);
    colors[id] = mcolor;
}